

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

void __thiscall
duckdb::SetColumnCommentInfo::Serialize(SetColumnCommentInfo *this,Serializer *serializer)

{
  AlterInfo::Serialize(&this->super_AlterInfo,serializer);
  Serializer::WriteProperty<duckdb::CatalogType>
            (serializer,300,"catalog_entry_type",&(this->super_AlterInfo).field_0x71);
  Serializer::WriteProperty<duckdb::Value>(serializer,0x12d,"comment_value",&this->comment_value);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x12e,"column_name",&this->column_name);
  return;
}

Assistant:

void SetColumnCommentInfo::Serialize(Serializer &serializer) const {
	AlterInfo::Serialize(serializer);
	serializer.WriteProperty<CatalogType>(300, "catalog_entry_type", catalog_entry_type);
	serializer.WriteProperty<Value>(301, "comment_value", comment_value);
	serializer.WritePropertyWithDefault<string>(302, "column_name", column_name);
}